

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_font_cid.c
# Opt level: O1

HPDF_STATUS CIDFontType2_BeforeWrite_Func(HPDF_Dict obj)

{
  void *pvVar1;
  long lVar2;
  char *value;
  HPDF_Dict dict;
  HPDF_STATUS HVar3;
  HPDF_STATUS HVar4;
  HPDF_STATUS HVar5;
  HPDF_STATUS HVar6;
  HPDF_STATUS HVar7;
  HPDF_STATUS HVar8;
  HPDF_Array obj_00;
  HPDF_STATUS HVar9;
  HPDF_STATUS HVar10;
  HPDF_STATUS HVar11;
  HPDF_STATUS HVar12;
  HPDF_STATUS HVar13;
  HPDF_Dict unaff_R12;
  bool bVar14;
  long local_40;
  
  pvVar1 = obj->attr;
  lVar2 = *(long *)((long)pvVar1 + 0x18);
  value = *(char **)(lVar2 + 0xf8);
  if (*(long *)((long)pvVar1 + 0x48) != 0) {
    *(HPDF_UINT *)(*(long *)((long)pvVar1 + 0x48) + 0x48) = obj->filter;
  }
  if (*(long *)((long)pvVar1 + 0x50) != 0) {
    *(HPDF_UINT *)(*(long *)((long)pvVar1 + 0x50) + 0x48) = obj->filter;
  }
  if (*(long *)(lVar2 + 0xe0) != 0) goto LAB_0011ff00;
  dict = HPDF_Dict_New(obj->mmgr);
  if (dict == (HPDF_Dict)0x0) {
    unaff_R12 = (HPDF_Dict)HPDF_Error_GetCode(obj->error);
LAB_0011fd5c:
    bVar14 = false;
  }
  else {
    if (*(int *)(value + 0x19c) == 0) {
      local_40 = 0;
    }
    else {
      unaff_R12 = HPDF_DictStream_New(obj->mmgr,*(HPDF_Xref *)((long)pvVar1 + 0x38));
      if ((unaff_R12 == (HPDF_Dict)0x0) ||
         (HVar3 = HPDF_TTFontDef_SaveFontData
                            (*(HPDF_FontDef *)((long)pvVar1 + 0x18),unaff_R12->stream), HVar3 != 0))
      {
        local_40 = 0;
LAB_0011fd32:
        unaff_R12 = (HPDF_Dict)HPDF_Error_GetCode(obj->error);
        bVar14 = false;
      }
      else {
        HVar3 = HPDF_Dict_Add(dict,"FontFile2",unaff_R12);
        HVar4 = HPDF_Dict_AddNumber(unaff_R12,"Length1",*(HPDF_INT32 *)(value + 0x198));
        HVar5 = HPDF_Dict_AddNumber(unaff_R12,"Length2",0);
        HVar6 = HPDF_Dict_AddNumber(unaff_R12,"Length3",0);
        unaff_R12->filter = obj->filter;
        local_40 = HVar6 + HVar5 + HVar3 + HVar4;
        if (local_40 != 0) goto LAB_0011fd32;
        bVar14 = true;
        local_40 = 0;
      }
      if (!bVar14) goto LAB_0011fd5c;
    }
    HVar3 = HPDF_Xref_Add(*(HPDF_Xref *)((long)pvVar1 + 0x38),dict);
    HVar4 = HPDF_Dict_AddName(dict,"Type","FontDescriptor");
    HVar5 = HPDF_Dict_AddNumber(dict,"Ascent",(int)*(short *)(lVar2 + 0xb8));
    HVar6 = HPDF_Dict_AddNumber(dict,"Descent",(int)*(short *)(lVar2 + 0xba));
    HVar7 = HPDF_Dict_AddNumber(dict,"CapHeight",(uint)*(ushort *)(lVar2 + 0xde));
    HVar8 = HPDF_Dict_AddNumber(dict,"Flags",*(HPDF_INT32 *)(lVar2 + 0xbc));
    obj_00 = HPDF_Box_Array_New(obj->mmgr,*(HPDF_Box *)(lVar2 + 0xc0));
    HVar9 = HPDF_Dict_Add(dict,"FontBBox",obj_00);
    HVar10 = HPDF_Dict_AddName(dict,"FontName",value);
    HVar11 = HPDF_Dict_AddNumber(dict,"ItalicAngle",(int)*(short *)(lVar2 + 0xd0));
    HVar12 = HPDF_Dict_AddNumber(dict,"StemV",(uint)*(ushort *)(lVar2 + 0xd2));
    HVar13 = HPDF_Dict_AddNumber(dict,"XHeight",(uint)*(ushort *)(lVar2 + 0xdc));
    bVar14 = HVar13 + HVar12 + HVar11 +
                      HVar10 + HVar9 + HVar8 + HVar7 + HVar6 + HVar5 + HVar4 + local_40 + HVar3 != 0
    ;
    if (bVar14) {
      unaff_R12 = (HPDF_Dict)HPDF_Error_GetCode(obj->error);
    }
    else {
      *(HPDF_Dict *)(*(long *)((long)pvVar1 + 0x18) + 0xe0) = dict;
    }
    bVar14 = !bVar14;
  }
  if (!bVar14) {
    return (HPDF_STATUS)unaff_R12;
  }
LAB_0011ff00:
  HVar3 = HPDF_Dict_AddName(obj,"BaseFont",value);
  if ((HVar3 == 0) &&
     (HVar3 = HPDF_Dict_AddName(*(HPDF_Dict *)((long)pvVar1 + 0x40),"BaseFont",value), HVar3 == 0))
  {
    HVar3 = HPDF_Dict_Add(*(HPDF_Dict *)((long)pvVar1 + 0x40),"FontDescriptor",
                          *(void **)(*(long *)((long)pvVar1 + 0x18) + 0xe0));
    return HVar3;
  }
  return HVar3;
}

Assistant:

static HPDF_STATUS
CIDFontType2_BeforeWrite_Func  (HPDF_Dict obj)
{
    HPDF_FontAttr font_attr = (HPDF_FontAttr)obj->attr;
    HPDF_FontDef def = font_attr->fontdef;
    HPDF_TTFontDefAttr def_attr = (HPDF_TTFontDefAttr)def->attr;
    HPDF_STATUS ret = 0;

    HPDF_PTRACE ((" CIDFontType2_BeforeWrite_Func\n"));

    if (font_attr->map_stream)
        font_attr->map_stream->filter = obj->filter;

    if (font_attr->cmap_stream)
        font_attr->cmap_stream->filter = obj->filter;

    if (!font_attr->fontdef->descriptor) {
        HPDF_Dict descriptor = HPDF_Dict_New (obj->mmgr);
        HPDF_Array array;

        if (!descriptor)
            return HPDF_Error_GetCode (obj->error);

        if (def_attr->embedding) {
            HPDF_Dict font_data = HPDF_DictStream_New (obj->mmgr,
                    font_attr->xref);

            if (!font_data)
                return HPDF_Error_GetCode (obj->error);

            if (HPDF_TTFontDef_SaveFontData (font_attr->fontdef,
                font_data->stream) != HPDF_OK)
                return HPDF_Error_GetCode (obj->error);

            ret += HPDF_Dict_Add (descriptor, "FontFile2", font_data);
            ret += HPDF_Dict_AddNumber (font_data, "Length1",
                    def_attr->length1);
            ret += HPDF_Dict_AddNumber (font_data, "Length2", 0);
            ret += HPDF_Dict_AddNumber (font_data, "Length3", 0);

            font_data->filter = obj->filter;

            if (ret != HPDF_OK)
                return HPDF_Error_GetCode (obj->error);
        }

        ret += HPDF_Xref_Add (font_attr->xref, descriptor);
        ret += HPDF_Dict_AddName (descriptor, "Type", "FontDescriptor");
        ret += HPDF_Dict_AddNumber (descriptor, "Ascent", def->ascent);
        ret += HPDF_Dict_AddNumber (descriptor, "Descent", def->descent);
        ret += HPDF_Dict_AddNumber (descriptor, "CapHeight", def->cap_height);
        ret += HPDF_Dict_AddNumber (descriptor, "Flags", def->flags);

        array = HPDF_Box_Array_New (obj->mmgr, def->font_bbox);
        ret += HPDF_Dict_Add (descriptor, "FontBBox", array);

        ret += HPDF_Dict_AddName (descriptor, "FontName", def_attr->base_font);
        ret += HPDF_Dict_AddNumber (descriptor, "ItalicAngle",
                def->italic_angle);
        ret += HPDF_Dict_AddNumber (descriptor, "StemV", def->stemv);
        ret += HPDF_Dict_AddNumber (descriptor, "XHeight", def->x_height);

        if (ret != HPDF_OK)
            return HPDF_Error_GetCode (obj->error);

        font_attr->fontdef->descriptor = descriptor;
    }

    if ((ret = HPDF_Dict_AddName (obj, "BaseFont",
                def_attr->base_font)) != HPDF_OK)
        return ret;

    if ((ret = HPDF_Dict_AddName (font_attr->descendant_font, "BaseFont",
                def_attr->base_font)) != HPDF_OK)
        return ret;

    return HPDF_Dict_Add (font_attr->descendant_font, "FontDescriptor",
                font_attr->fontdef->descriptor);
}